

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool operator==(BigNum *a,BigNum *b)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  BigNum *this;
  BigNum local_a0;
  BigNum local_80;
  BigNum local_60;
  BigNum local_40;
  
  BigNum::BigNum(&local_80,a);
  this = &local_a0;
  BigNum::BigNum(this,b);
  if (local_80.sign == local_a0.sign) {
    uVar5 = (ulong)(uint)local_80.length;
    local_80.sign = true;
    if (local_80.length <= local_a0.length) {
      if (local_80.length < local_a0.length) {
        local_80.sign = false;
      }
      else {
        do {
          local_80.sign = SUB81(this,0);
          iVar4 = (int)uVar5;
          if (iVar4 < 1) goto LAB_0010249e;
          uVar1 = local_80.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar5 - 1];
          this = (BigNum *)(ulong)uVar1;
          lVar2 = uVar5 - 1;
          if (local_a0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar2] < (int)uVar1) {
            local_80.sign = true;
            goto LAB_0010249e;
          }
          uVar5 = uVar5 - 1;
        } while (local_a0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar2] <= (int)uVar1);
        local_80.sign = false;
LAB_0010249e:
        local_80.sign = (bool)(0 < iVar4 & local_80.sign);
      }
    }
  }
  bVar3 = true;
  if (local_80.sign == false) {
    BigNum::BigNum(&local_40,a);
    BigNum::BigNum(&local_60,b);
    bVar3 = operator<(&local_40,&local_60);
    if (local_60.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_60.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_40.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_40.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_40.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_40.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  if (local_a0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_80.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (bool)(bVar3 ^ 1);
}

Assistant:

bool operator ==(BigNum a, BigNum b){
    return !(a > b || a < b);
}